

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

string * __thiscall duckdb::Vector::ToString(Vector *this)

{
  VectorType VVar1;
  Value *this_00;
  Vector *in_RSI;
  string *in_RDI;
  string *retval;
  LogicalType *in_stack_000004c8;
  char *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  VectorType in_stack_ffffffffffffff1f;
  string local_c8 [32];
  Value *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  GetVectorType(in_RSI);
  __rhs = &local_78;
  VectorTypeToString(in_stack_ffffffffffffff1f);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0
            );
  GetType(in_RSI);
  LogicalType::ToString(in_stack_000004c8);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            (in_stack_fffffffffffffef8,__rhs);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0
            );
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  VVar1 = GetVectorType(in_RSI);
  this_00 = (Value *)(ulong)VVar1;
  switch(this_00) {
  case (Value *)0x0:
  case (Value *)0x3:
    break;
  default:
    ::std::__cxx11::string::operator+=((string *)in_RDI,"UNKNOWN VECTOR TYPE");
    break;
  case (Value *)0x2:
    GetValue((Vector *)CONCAT17(VVar1,in_stack_fffffffffffffec8),(idx_t)this_00);
    Value::ToString(in_stack_ffffffffffffff58);
    ::std::__cxx11::string::operator+=((string *)in_RDI,local_c8);
    ::std::__cxx11::string::~string(local_c8);
    Value::~Value(this_00);
    break;
  case (Value *)0x4:
  }
  ::std::__cxx11::string::operator+=((string *)in_RDI,"]");
  return in_RDI;
}

Assistant:

string Vector::ToString() const {
	string retval = VectorTypeToString(GetVectorType()) + " " + GetType().ToString() + ": (UNKNOWN COUNT) [ ";
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
	case VectorType::DICTIONARY_VECTOR:
		break;
	case VectorType::CONSTANT_VECTOR:
		retval += GetValue(0).ToString();
		break;
	case VectorType::SEQUENCE_VECTOR: {
		break;
	}
	default:
		retval += "UNKNOWN VECTOR TYPE";
		break;
	}
	retval += "]";
	return retval;
}